

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O2

wostream * mjs::operator<<(wostream *os,regexp_flag f)

{
  wostream *pwVar1;
  regexp_flag in_EDX;
  undefined4 in_register_00000034;
  wstring local_30;
  
  regexp_flags_to_string_abi_cxx11_(&local_30,(mjs *)CONCAT44(in_register_00000034,f),in_EDX);
  pwVar1 = std::operator<<(os,(wstring *)&local_30);
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  return pwVar1;
}

Assistant:

std::wostream& operator<<(std::wostream& os, regexp_flag f) {
    return os << regexp_flags_to_string(f);
}